

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_gears.c
# Opt level: O3

void draw_gear(gears_t_conflict1 *gears,int id,float model_tx,float model_ty,float model_rz,
              float *color)

{
  gear_conflict *pgVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  float pos [4];
  float ModelViewProjection [16];
  GLfloat local_108 [4];
  float local_f8 [13];
  float fStack_c4;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pgVar1 = gears->gear[(uint)id];
  local_108[0] = 5.0;
  local_108[1] = 5.0;
  local_108[2] = 10.0;
  local_108[3] = 0.0;
  if (pgVar1 != (gear_conflict *)0x0) {
    iVar9 = (*gears->glGetUniformLocation)(gears->program,"u_LightPos");
    (*gears->glUniform4fv)(iVar9,1,local_108);
    local_78 = *(undefined8 *)gears->View;
    uStack_70 = *(ulong *)(gears->View + 2);
    local_68 = *(undefined8 *)(gears->View + 4);
    uStack_60 = *(ulong *)(gears->View + 6);
    local_58 = *(ulong *)(gears->View + 8);
    uStack_50 = *(ulong *)(gears->View + 10);
    local_48 = *(undefined8 *)(gears->View + 0xc);
    uStack_40 = *(undefined8 *)(gears->View + 0xe);
    local_f8[0] = 1.0;
    local_f8[1] = 0.0;
    local_f8[2] = 0.0;
    local_f8[3] = 0.0;
    local_f8[4] = 0.0;
    local_f8[5] = 1.0;
    local_f8[6] = 0.0;
    local_f8[7] = 0.0;
    local_f8[8] = 0.0;
    local_f8[9] = 0.0;
    local_f8[10] = 1.0;
    local_f8[0xb] = 0.0;
    local_c0 = 0x3f80000000000000;
    local_f8[0xc] = model_tx;
    fStack_c4 = model_ty;
    multiply((float *)&local_78,local_f8);
    rotate((float *)&local_78,model_rz,0.0,0.0,1.0);
    local_b8 = *(undefined8 *)gears->Projection;
    uStack_b0 = *(undefined8 *)(gears->Projection + 2);
    local_a8 = *(undefined8 *)(gears->Projection + 4);
    uStack_a0 = *(undefined8 *)(gears->Projection + 6);
    local_98 = *(undefined8 *)(gears->Projection + 8);
    uStack_90 = *(undefined8 *)(gears->Projection + 10);
    local_88 = *(undefined8 *)(gears->Projection + 0xc);
    uStack_80 = *(undefined8 *)(gears->Projection + 0xe);
    multiply((float *)&local_b8,(float *)&local_78);
    iVar9 = (*gears->glGetUniformLocation)(gears->program,"u_ModelViewProjectionMatrix");
    (*gears->glUniformMatrix4fv)(iVar9,1,'\0',(GLfloat *)&local_b8);
    uVar4 = uStack_70;
    local_f8[0] = 1.0;
    local_f8[1] = 0.0;
    local_f8[2] = 0.0;
    local_f8[3] = 0.0;
    local_f8[4] = 0.0;
    local_f8[5] = 1.0;
    local_f8[6] = 0.0;
    local_f8[7] = 0.0;
    local_f8[8] = 0.0;
    local_f8[9] = 0.0;
    local_f8[0xc] = (float)((uint)local_48 ^ 0x80000000);
    fStack_c4 = (float)((uint)((ulong)local_48 >> 0x20) ^ 0x80000000);
    local_f8[10] = 1.0;
    local_f8[0xb] = 0.0;
    local_c0 = CONCAT44(0x3f800000,(uint)uStack_40 ^ 0x80000000);
    uVar2 = local_58 >> 0x20;
    uVar3 = local_78._4_4_;
    local_48._0_4_ = uStack_70._4_4_;
    uVar5 = uStack_50._4_4_;
    local_78._4_4_ = (undefined4)local_68;
    uStack_70 = local_58 & 0xffffffff;
    local_68._0_4_ = uVar3;
    local_58._0_4_ = (undefined4)uVar4;
    local_58._4_4_ = (undefined4)uStack_60;
    uStack_50 = uStack_50 & 0xffffffff;
    local_48._4_4_ = uStack_60._4_4_;
    uStack_40._0_4_ = uVar5;
    uStack_60 = uVar2;
    multiply((float *)&local_78,local_f8);
    uVar2 = uStack_70;
    uVar3 = local_78._4_4_;
    uVar6 = (undefined4)uStack_60;
    uVar5 = uStack_70._4_4_;
    uVar7 = uStack_60._4_4_;
    uVar8 = uStack_50._4_4_;
    local_78 = CONCAT44((undefined4)local_68,(float)local_78);
    uStack_70 = CONCAT44((undefined4)local_48,(undefined4)local_58);
    local_68 = CONCAT44(local_68._4_4_,uVar3);
    uStack_60 = CONCAT44(local_48._4_4_,local_58._4_4_);
    local_58 = CONCAT44(uVar6,(int)uVar2);
    uStack_50 = CONCAT44((uint)uStack_40,(undefined4)uStack_50);
    local_48 = CONCAT44(uVar7,uVar5);
    uStack_40 = CONCAT44(uStack_40._4_4_,uVar8);
    iVar9 = (*gears->glGetUniformLocation)(gears->program,"u_NormalMatrix");
    (*gears->glUniformMatrix4fv)(iVar9,1,'\0',(GLfloat *)&local_78);
    iVar9 = (*gears->glGetUniformLocation)(gears->program,"u_Color");
    (*gears->glUniform4fv)(iVar9,1,color);
    iVar9 = (*gears->glGetUniformLocation)(gears->program,"u_TextureEnable");
    pcVar10 = getenv("NO_TEXTURE");
    (*gears->glUniform1i)(iVar9,SUB14(pcVar10 == (char *)0x0,0));
    (*gears->glBindBuffer)(0x8892,pgVar1->vbo);
    (*gears->glVertexAttribPointer)(0,3,0x1406,'\0',0x20,(GLvoid *)0x0);
    (*gears->glVertexAttribPointer)(1,3,0x1406,'\0',0x20,(GLvoid *)0xc);
    (*gears->glVertexAttribPointer)(2,2,0x1406,'\0',0x20,(GLvoid *)0x18);
    (*gears->glEnableVertexAttribArray)(0);
    (*gears->glEnableVertexAttribArray)(1);
    (*gears->glEnableVertexAttribArray)(2);
    if (0 < pgVar1->nstrips) {
      lVar11 = 0;
      do {
        (*gears->glDrawArrays)(5,pgVar1->strips[lVar11].begin,pgVar1->strips[lVar11].count);
        lVar11 = lVar11 + 1;
      } while (lVar11 < pgVar1->nstrips);
    }
    (*gears->glDisableVertexAttribArray)(2);
    (*gears->glDisableVertexAttribArray)(1);
    (*gears->glDisableVertexAttribArray)(0);
  }
  return;
}

Assistant:

static void draw_gear(gears_t *gears, int id, float model_tx, float model_ty, float model_rz, const float *color)
{
  struct gear *gear = gears->gear[id];
  const float pos[4] = { 5.0, 5.0, 10.0, 0.0 };

  if (!gear) {
    return;
  }

  glPushMatrix();
  glLoadIdentity();
  glLightfv(GL_LIGHT0, GL_POSITION, pos);
  glPopMatrix();

  glPushMatrix();

  glTranslatef(model_tx, model_ty, 0);
  glRotatef(model_rz, 0, 0, 1);

  glMaterialfv(GL_FRONT_AND_BACK, GL_AMBIENT_AND_DIFFUSE, color);

  if (getenv("NO_TEXTURE"))
    glDisable(GL_TEXTURE_2D);
  else
    glEnable(GL_TEXTURE_2D);

  glCallList(gear->list);

  glPopMatrix();
}